

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

void __thiscall NaVector::min_max(NaVector *this,NaReal *vMin,NaReal *vMax)

{
  NaReal NVar1;
  NaReal *pNVar2;
  uint uVar3;
  uint i;
  ulong uVar4;
  double dVar5;
  
  uVar4 = 0;
  while( true ) {
    uVar3 = (*this->_vptr_NaVector[6])(this);
    if (uVar3 <= uVar4) break;
    pNVar2 = this->pVect;
    if (uVar4 == 0) {
      NVar1 = *pNVar2;
      *vMax = NVar1;
      *vMin = NVar1;
    }
    else {
      dVar5 = pNVar2[uVar4];
      if (dVar5 < *vMin) {
        *vMin = dVar5;
        dVar5 = pNVar2[uVar4];
      }
      if (*vMax <= dVar5 && dVar5 != *vMax) {
        *vMax = dVar5;
      }
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void
NaVector::min_max (NaReal& vMin, NaReal& vMax) const
{
    unsigned    i;
    for(i = 0; i < dim(); ++i){
        if(0 == i)
            vMin = vMax = pVect[i];
        else{
            if(pVect[i] < vMin)
                vMin = pVect[i];
            if(pVect[i] > vMax)
                vMax = pVect[i];
        }
    }
}